

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

string * __thiscall
OSTEI_HRR_Writer::HRRBraStepVar_
          (string *__return_storage_ptr__,OSTEI_HRR_Writer *this,Doublet *d,string *ncart_ket,
          string *ketstr)

{
  char *pcVar1;
  int __c;
  Doublet *dbra;
  allocator local_a9;
  string local_a8;
  string arrname;
  undefined1 local_68 [64];
  
  Doublet::Doublet((Doublet *)local_68,d);
  std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
  dbra = (Doublet *)local_68;
  ArrVarName(&arrname,dbra,ketstr,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  pcVar1 = Doublet::index(d,(char *)dbra,__c);
  local_a8._M_dataplus._M_p._0_4_ = SUB84(pcVar1,0);
  StringBuilder<char[5],std::__cxx11::string&,char_const(&)[2],int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
            (__return_storage_ptr__,(char (*) [5])0x13b2ec,&arrname,(char (*) [2])0x13b083,
             (int *)&local_a8,(char (*) [4])0x13ab33,ncart_ket,(char (*) [9])" + iket]");
  std::__cxx11::string::~string((string *)&arrname);
  return __return_storage_ptr__;
}

Assistant:

std::string OSTEI_HRR_Writer::HRRBraStepVar_(const Doublet & d, const std::string & ncart_ket, 
                                             const std::string & ketstr) const
{
    std::string arrname = ArrVarName(d, ketstr);
    return StringBuilder("HRR_", arrname, "[", d.index(), " * ", ncart_ket, " + iket]"); 
}